

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O3

void duckdb::PhysicalOrder::ScheduleMergeTasks
               (Pipeline *pipeline,Event *event,OrderGlobalSinkState *state)

{
  shared_ptr<duckdb::OrderMergeEvent,_true> new_event;
  undefined1 local_59;
  shared_ptr<duckdb::OrderMergeEvent,_true> local_58;
  shared_ptr<duckdb::Event,_true> local_48;
  shared_ptr<duckdb::OrderMergeEvent> local_30;
  
  GlobalSortState::InitializeMergeRound(&state->global_sort_state);
  local_30.super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::OrderMergeEvent,std::allocator<duckdb::OrderMergeEvent>,duckdb::OrderGlobalSinkState&,duckdb::Pipeline&,duckdb::PhysicalOrder_const&>
            (&local_30.super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(OrderMergeEvent **)&local_30,
             (allocator<duckdb::OrderMergeEvent> *)&local_59,state,pipeline,state->order);
  shared_ptr<duckdb::OrderMergeEvent,_true>::shared_ptr(&local_58,&local_30);
  if (local_30.super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_58.internal.super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_58.internal.super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  local_58.internal.super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.internal.super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Event::InsertEvent(event,&local_48);
  if (local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.internal.super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.internal.
               super___shared_ptr<duckdb::OrderMergeEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void PhysicalOrder::ScheduleMergeTasks(Pipeline &pipeline, Event &event, OrderGlobalSinkState &state) {
	// Initialize global sort state for a round of merging
	state.global_sort_state.InitializeMergeRound();
	auto new_event = make_shared_ptr<OrderMergeEvent>(state, pipeline, state.order);
	event.InsertEvent(std::move(new_event));
}